

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::Decode
          (LE_DeadReckoningParameter *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  LE_DeadReckoningParameter *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 7) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui8DeadRecknoningAlgorithm);
  pKVar2 = operator>>(pKVar2,&(this->m_LinearAcceleration).super_DataTypeBase);
  operator>>(pKVar2,&(this->m_AngularVelocity).super_DataTypeBase);
  return;
}

Assistant:

void LE_DeadReckoningParameter::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LE_DEAD_RECKONING_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8DeadRecknoningAlgorithm
           >> KDIS_STREAM m_LinearAcceleration
           >> KDIS_STREAM m_AngularVelocity;
}